

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.cpp
# Opt level: O0

void __thiscall
Js::ScopeInfo::SaveSymbolInfo(ScopeInfo *this,Symbol *sym,MapSymbolData *mapSymbolData)

{
  bool bVar1;
  bool bVar2;
  SymbolType symbolType;
  uint uVar3;
  PropertyId propertyId_00;
  uint uVar4;
  Scope *this_00;
  CharacterBuffer<char16_t> *this_01;
  char16_t *pcVar5;
  int local_28;
  PropertyId propertyId;
  PropertyId scopeSlot;
  bool needScopeSlot;
  MapSymbolData *mapSymbolData_local;
  Symbol *sym_local;
  ScopeInfo *this_local;
  
  bVar1 = Symbol::GetHasNonLocalReference(sym);
  local_28 = 0xffff;
  bVar2 = Symbol::GetIsModuleExportStorage(sym);
  if (bVar2) {
    this_00 = Symbol::GetScope(sym);
    uVar3 = Scope::GetScopeSlotCount(this_00);
    local_28 = mapSymbolData->nonScopeSymbolCount;
    mapSymbolData->nonScopeSymbolCount = local_28 + 1;
    local_28 = uVar3 + local_28;
  }
  else if (bVar1) {
    local_28 = Symbol::EnsureScopeSlot(sym,mapSymbolData->byteCodeGenerator,mapSymbolData->func);
  }
  if ((bVar1) || (bVar1 = Symbol::GetIsModuleExportStorage(sym), bVar1)) {
    propertyId_00 = Symbol::EnsurePosition(sym,mapSymbolData->func);
    SetSymbolId(this,local_28,propertyId_00);
    symbolType = Symbol::GetSymbolType(sym);
    SetSymbolType(this,local_28,symbolType);
    bVar1 = Symbol::GetHasFuncAssignment(sym);
    SetHasFuncAssignment(this,local_28,bVar1);
    bVar1 = Symbol::GetIsBlockVar(sym);
    SetIsBlockVariable(this,local_28,bVar1);
    bVar1 = Symbol::GetIsConst(sym);
    SetIsConst(this,local_28,bVar1);
    bVar1 = Symbol::GetIsFuncExpr(sym);
    SetIsFuncExpr(this,local_28,bVar1);
    bVar1 = Symbol::GetIsModuleExportStorage(sym);
    SetIsModuleExportStorage(this,local_28,bVar1);
    bVar1 = Symbol::GetIsModuleImport(sym);
    SetIsModuleImport(this,local_28,bVar1);
    bVar1 = Symbol::GetNeedDeclaration(sym);
    SetNeedDeclaration(this,local_28,bVar1);
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ByteCodePhase);
  if (bVar1) {
    this_01 = Symbol::GetName(sym);
    pcVar5 = JsUtil::CharacterBuffer<char16_t>::GetBuffer(this_01);
    uVar4 = Symbol::GetScopeSlot(sym);
    Output::Print(L"%12s %d\n",pcVar5,(ulong)uVar4);
  }
  return;
}

Assistant:

void ScopeInfo::SaveSymbolInfo(Symbol* sym, MapSymbolData* mapSymbolData)
    {
        bool needScopeSlot = sym->GetHasNonLocalReference();
        Js::PropertyId scopeSlot = Constants::NoSlot;

        if (sym->GetIsModuleExportStorage())
        {
            // Export symbols aren't in slots but we need to persist the fact that they are export storage
            scopeSlot = sym->GetScope()->GetScopeSlotCount() + mapSymbolData->nonScopeSymbolCount++;
        }
        else if (needScopeSlot)
        {
            // Any symbol may have non-local ref from deferred child. Allocate slot for it.
            scopeSlot = sym->EnsureScopeSlot(mapSymbolData->byteCodeGenerator, mapSymbolData->func);
        }

        if (needScopeSlot || sym->GetIsModuleExportStorage())
        {
            Js::PropertyId propertyId = sym->EnsurePosition(mapSymbolData->func);
            this->SetSymbolId(scopeSlot, propertyId);
            this->SetSymbolType(scopeSlot, sym->GetSymbolType());
            this->SetHasFuncAssignment(scopeSlot, sym->GetHasFuncAssignment());
            this->SetIsBlockVariable(scopeSlot, sym->GetIsBlockVar());
            this->SetIsConst(scopeSlot, sym->GetIsConst());
            this->SetIsFuncExpr(scopeSlot, sym->GetIsFuncExpr());
            this->SetIsModuleExportStorage(scopeSlot, sym->GetIsModuleExportStorage());
            this->SetIsModuleImport(scopeSlot, sym->GetIsModuleImport());
            this->SetNeedDeclaration(scopeSlot, sym->GetNeedDeclaration());
        }

        TRACE_BYTECODE(_u("%12s %d\n"), sym->GetName().GetBuffer(), sym->GetScopeSlot());
    }